

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

Identifier __thiscall soul::StructuralParser::parseIdentifier(StructuralParser *this)

{
  Allocator *pAVar1;
  Identifier IVar2;
  string_view newString;
  string local_30;
  
  pAVar1 = this->allocator;
  Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>::
  readIdentifier_abi_cxx11_
            (&local_30,
             (Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
              *)this);
  newString._M_str = local_30._M_dataplus._M_p;
  newString._M_len = local_30._M_string_length;
  IVar2 = Identifier::Pool::get(&pAVar1->identifiers,newString);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return (Identifier)IVar2.name;
}

Assistant:

Identifier parseIdentifier()
    {
        return allocator.identifiers.get (readIdentifier());
    }